

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O1

Result<wasm::Table_*> * __thiscall
wasm::WATParser::ParseDeclsCtx::addTableDecl
          (Result<wasm::Table_*> *__return_storage_ptr__,ParseDeclsCtx *this,Index pos,Name name,
          ImportNames *importNames,TableType type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint __val;
  uint uVar3;
  Table *pTVar4;
  long *plVar5;
  uint uVar6;
  _Storage<unsigned_long,_true> _Var7;
  char *pcVar8;
  ulong *puVar9;
  ulong uVar10;
  uint __len;
  string_view sVar11;
  string local_a0;
  long *local_80 [2];
  long local_70 [2];
  ImportNames *local_60;
  Err local_58;
  _Head_base<0UL,_wasm::Table_*,_false> local_38;
  __single_object t;
  
  local_60 = importNames;
  local_38._M_head_impl = (Table *)operator_new(0x58);
  ((local_38._M_head_impl)->max).addr = 0;
  ((local_38._M_head_impl)->addressType).id = 0;
  ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len = 0;
  ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str =
       (char *)0x0;
  *(undefined8 *)&((local_38._M_head_impl)->super_Importable).super_Named.hasExplicitName = 0;
  ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_len = 0;
  ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_str = (char *)0x0;
  ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_len = 0;
  ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_str = (char *)0x0;
  ((local_38._M_head_impl)->initial).addr = 0;
  ((local_38._M_head_impl)->max).addr = 0xffffffff;
  ((local_38._M_head_impl)->addressType).id = 2;
  ((local_38._M_head_impl)->type).id = 0x12;
  ((local_38._M_head_impl)->addressType).id = type.addressType.id;
  ((local_38._M_head_impl)->initial).addr = type.limits.initial;
  _Var7._M_value = 0xffffffff;
  if (type.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged != false) {
    _Var7._M_value =
         type.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload._M_value;
  }
  ((local_38._M_head_impl)->max).addr = (address64_t)_Var7;
  if (name.super_IString.str._M_str == (char *)0x0) {
    uVar2 = this->tableCounter;
    this->tableCounter = uVar2 + 1;
    __val = -uVar2;
    if (0 < (int)uVar2) {
      __val = uVar2;
    }
    __len = 1;
    if (9 < __val) {
      uVar10 = (ulong)__val;
      uVar3 = 4;
      do {
        __len = uVar3;
        uVar6 = (uint)uVar10;
        if (uVar6 < 100) {
          __len = __len - 2;
          goto LAB_00b8bdc9;
        }
        if (uVar6 < 1000) {
          __len = __len - 1;
          goto LAB_00b8bdc9;
        }
        if (uVar6 < 10000) goto LAB_00b8bdc9;
        uVar10 = uVar10 / 10000;
        uVar3 = __len + 4;
      } while (99999 < uVar6);
      __len = __len + 1;
    }
LAB_00b8bdc9:
    local_80[0] = local_70;
    std::__cxx11::string::_M_construct((ulong)local_80,(char)__len - (char)((int)uVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_80[0]),__len,__val);
    pcVar8 = "timport$";
    if (local_60 == (ImportNames *)0x0) {
      pcVar8 = "";
    }
    plVar5 = (long *)std::__cxx11::string::replace((ulong)local_80,0,(char *)0x0,(ulong)pcVar8);
    paVar1 = &local_58.msg.field_2;
    puVar9 = (ulong *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar9) {
      local_58.msg.field_2._M_allocated_capacity = *puVar9;
      local_58.msg.field_2._8_8_ = plVar5[3];
      local_58.msg._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_58.msg.field_2._M_allocated_capacity = *puVar9;
      local_58.msg._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_58.msg._M_string_length = plVar5[1];
    *plVar5 = (long)puVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    sVar11._M_str = (char *)0x0;
    sVar11._M_len = (size_t)local_58.msg._M_dataplus._M_p;
    sVar11 = IString::interned((IString *)local_58.msg._M_string_length,sVar11,SUB81(puVar9,0));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.msg._M_dataplus._M_p != paVar1) {
      operator_delete(local_58.msg._M_dataplus._M_p,local_58.msg.field_2._M_allocated_capacity + 1);
    }
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    sVar11 = (string_view)Names::getValidTableName(this->wasm,(Name)sVar11);
    ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str = sVar11;
  }
  else {
    pTVar4 = Module::getTableOrNull(this->wasm,name);
    if (pTVar4 != (Table *)0x0) {
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"repeated table name","");
      Lexer::err(&local_58,&this->in,(ulong)pos,&local_a0);
      puVar9 = (ulong *)((long)&(__return_storage_ptr__->val).
                                super__Variant_base<wasm::Table_*,_wasm::Err>.
                                super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Table_*,_wasm::Err>.
                                super__Variant_storage_alias<wasm::Table_*,_wasm::Err> + 0x10);
      *(ulong **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Table_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Table_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Table_*,_wasm::Err> = puVar9;
      paVar1 = &local_58.msg.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.msg._M_dataplus._M_p == paVar1) {
        *puVar9 = local_58.msg.field_2._M_allocated_capacity;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Table_*,_wasm::Err>.
                 super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Table_*,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Table_*,_wasm::Err> + 0x18) =
             local_58.msg.field_2._8_8_;
      }
      else {
        *(pointer *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Table_*,_wasm::Err>.
          super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
          super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
          super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Table_*,_wasm::Err>.
          super__Variant_storage_alias<wasm::Table_*,_wasm::Err> = local_58.msg._M_dataplus._M_p;
        *(size_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Table_*,_wasm::Err>.
                 super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Table_*,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Table_*,_wasm::Err> + 0x10) =
             local_58.msg.field_2._M_allocated_capacity;
      }
      *(size_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Table_*,_wasm::Err>.
               super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
               super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
               super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Table_*,_wasm::Err>.
               super__Variant_storage_alias<wasm::Table_*,_wasm::Err> + 8) =
           local_58.msg._M_string_length;
      local_58.msg._M_string_length = 0;
      local_58.msg.field_2._M_allocated_capacity =
           local_58.msg.field_2._M_allocated_capacity & 0xffffffffffffff00;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Table_*,_wasm::Err>.
               super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
               super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
               super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Table_*,_wasm::Err>.
               super__Variant_storage_alias<wasm::Table_*,_wasm::Err> + 0x20) = '\x01';
      local_58.msg._M_dataplus._M_p = (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00b8befb;
    }
    ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len =
         name.super_IString.str._M_len;
    ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str =
         name.super_IString.str._M_str;
    ((local_38._M_head_impl)->super_Importable).super_Named.hasExplicitName = true;
  }
  if (local_60 != (ImportNames *)0x0) {
    pcVar8 = (local_60->mod).super_IString.str._M_str;
    ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_len =
         (local_60->mod).super_IString.str._M_len;
    ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_str = pcVar8;
    pcVar8 = (local_60->nm).super_IString.str._M_str;
    ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_len =
         (local_60->nm).super_IString.str._M_len;
    ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_str = pcVar8;
  }
  pTVar4 = Module::addTable(this->wasm,
                            (unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)&local_38)
  ;
  *(Table **)
   &(__return_storage_ptr__->val).super__Variant_base<wasm::Table_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Table_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Table_*,_wasm::Err> = pTVar4;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Table_*,_wasm::Err>.
           super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
           super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
           super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Table_*,_wasm::Err>.
           super__Variant_storage_alias<wasm::Table_*,_wasm::Err> + 0x20) = '\0';
LAB_00b8befb:
  if (local_38._M_head_impl != (Table *)0x0) {
    operator_delete(local_38._M_head_impl,0x58);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<Table*> ParseDeclsCtx::addTableDecl(Index pos,
                                           Name name,
                                           ImportNames* importNames,
                                           TableType type) {
  auto t = std::make_unique<Table>();
  t->addressType = type.addressType;
  t->initial = type.limits.initial;
  t->max = type.limits.max ? *type.limits.max : Table::kUnlimitedSize;
  if (name.is()) {
    if (wasm.getTableOrNull(name)) {
      // TODO: if the existing table is not explicitly named, fix its name and
      // continue.
      return in.err(pos, "repeated table name");
    }
    t->setExplicitName(name);
  } else {
    name = (importNames ? "timport$" : "") + std::to_string(tableCounter++);
    name = Names::getValidTableName(wasm, name);
    t->name = name;
  }
  applyImportNames(*t, importNames);
  return wasm.addTable(std::move(t));
}